

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void parlist(LexState *ls)

{
  FuncState *fs_00;
  Proto *pPVar1;
  ravi_type_map rVar2;
  int iVar3;
  uint uVar4;
  LocVar *pLVar5;
  bool bVar6;
  TString *pTStack_698;
  ravi_type_map tm;
  TString *usertype;
  int i;
  TString *typenames [135];
  ravi_type_map local_248 [2];
  ravi_type_map vars [135];
  int local_24;
  int nparams;
  Proto *f;
  FuncState *fs;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  pPVar1 = fs_00->f;
  local_24 = 0;
  memset(local_248,0,0x21c);
  memset(&stack0xfffffffffffff978,0,0x438);
  pPVar1->is_vararg = '\0';
  if ((ls->t).token != 0x29) {
    do {
      iVar3 = (ls->t).token;
      if (iVar3 == 0x11a) {
        luaX_next(ls);
        pPVar1->is_vararg = '\x01';
      }
      else {
        if (iVar3 != 0x125) {
          luaX_syntaxerror(ls,"<name> or \'...\' expected");
        }
        rVar2 = declare_localvar(ls,(TString **)(&stack0xfffffffffffff978 + (long)local_24 * 8));
        vars[(long)local_24 + -2] = rVar2;
        local_24 = local_24 + 1;
      }
      bVar6 = false;
      if (pPVar1->is_vararg == '\0') {
        iVar3 = testnext(ls,0x2c);
        bVar6 = iVar3 != 0;
      }
    } while (bVar6);
  }
  adjustlocalvars(ls,local_24);
  pPVar1->numparams = fs_00->nactvar;
  luaK_reserveregs(fs_00,(uint)fs_00->nactvar);
  for (usertype._4_4_ = 0; usertype._4_4_ < (int)(uint)pPVar1->numparams;
      usertype._4_4_ = usertype._4_4_ + 1) {
    pTStack_698 = (TString *)0x0;
    rVar2 = raviY_get_register_typeinfo(fs_00,usertype._4_4_,&stack0xfffffffffffff968);
    if ((ravi_parser_debug & 4U) != 0) {
      uVar4 = usertype._4_4_ + 1;
      pLVar5 = getlocvar(fs_00,usertype._4_4_);
      raviY_printf(fs_00,"Parameter [%d] = %v\n",(ulong)uVar4,pLVar5);
    }
    ravi_code_typecoersion(ls,usertype._4_4_,rVar2,pTStack_698);
  }
  return;
}

Assistant:

static void parlist (LexState *ls) {
  /* parlist -> [ param { ',' param } ] */
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  int nparams = 0;
  enum { N = MAXVARS + 10 };
  ravi_type_map vars[N] = { 0 };
  TString *typenames[N] = { NULL };
  f->is_vararg = 0;
  if (ls->t.token != ')') {  /* is 'parlist' not empty? */
    do {
      switch (ls->t.token) {
        case TK_NAME: {  /* param -> NAME */
          /* RAVI change - add type */
          vars[nparams] = declare_localvar(ls, &typenames[nparams]);
          nparams++;
          break;
        }
        case TK_DOTS: {  /* param -> '...' */
          luaX_next(ls);
          f->is_vararg = 1;  /* declared vararg */
          break;
        }
        default: luaX_syntaxerror(ls, "<name> or '...' expected");
      }
    } while (!f->is_vararg && testnext(ls, ','));
  }
  adjustlocalvars(ls, nparams);
  f->numparams = cast_byte(fs->nactvar);
  luaK_reserveregs(fs, fs->nactvar);  /* reserve register for parameters */
  for (int i = 0; i < f->numparams; i++) {
    TString *usertype = NULL;
    ravi_type_map tm = raviY_get_register_typeinfo(fs, i, &usertype);
    lua_assert((i < nparams && vars[i] == tm) || 1);
    lua_assert((i < nparams && usertype == typenames[i]) || 1);
    DEBUG_VARS(raviY_printf(fs, "Parameter [%d] = %v\n", i + 1, getlocvar(fs, i)));
    /* do we need to convert ? */
    ravi_code_typecoersion(ls, i, tm, usertype);
  }
}